

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O3

double hz_to_mel(double frequencies,bool htk)

{
  undefined3 in_register_00000039;
  double dVar1;
  
  if (CONCAT31(in_register_00000039,htk) == 0) {
    if (1000.0 <= frequencies) {
      dVar1 = log(frequencies / 1000.0);
      dVar1 = dVar1 / 0.06875177742094912 + 14.999999999999998;
    }
    else {
      dVar1 = frequencies / 66.66666666666667;
    }
  }
  else {
    dVar1 = log10(frequencies / 700.0 + 1.0);
    dVar1 = dVar1 * 2595.0;
  }
  return dVar1;
}

Assistant:

double hz_to_mel(double frequencies, bool htk = false) {
    if (htk) {
        return 2595.0 * log10(1.0 + frequencies / 700.0);
    }
    // Fill in the linear part
    double f_min = 0.0;
    double f_sp = 200.0 / 3;
    double mels = (frequencies - f_min) / f_sp;
    // Fill in the log-scale part
    double min_log_hz = 1000.0;                         // beginning of log region (Hz)
    double min_log_mel = (min_log_hz - f_min) / f_sp;   // same (Mels)
    double logstep = log(6.4) / 27.0;              // step size for log region

    // 对照Python平台的librosa库，移植
    //如果是多维数列
//    if (frequencies.ndim) {
//        // If we have array data, vectorize
//        log_t = (frequencies >= min_log_hz)
//        mels[log_t] = min_log_mel + np.log(frequencies[log_t] / min_log_hz) / logstep
//    } else
    if (frequencies >= min_log_hz) {
        // If we have scalar data, heck directly
        mels = min_log_mel + log(frequencies / min_log_hz) / logstep;
    }
    return mels;
}